

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

CompilerGLSL * __thiscall
spirv_cross::CompilerGLSL::flattened_access_chain_matrix_abi_cxx11_
          (CompilerGLSL *this,uint32_t base,uint32_t *indices,uint32_t count,SPIRType *target_type,
          uint32_t offset,uint32_t matrix_stride,bool need_transpose)

{
  undefined4 in_register_00000034;
  undefined4 in_register_0000008c;
  undefined3 in_stack_00000011;
  byte in_stack_00000018;
  undefined1 local_1f8 [40];
  uint32_t i;
  undefined1 local_1c8 [48];
  SPIRType tmp_type;
  bool need_transpose_local;
  SPIRType *target_type_local;
  uint32_t count_local;
  uint32_t *indices_local;
  uint32_t base_local;
  CompilerGLSL *this_local;
  string *expr;
  
  tmp_type.member_name_cache._M_h._M_single_bucket._7_1_ = in_stack_00000018 & 1;
  if (_need_transpose == 0) {
    __assert_fail("matrix_stride",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]SPIRV-Cross/spirv_glsl.cpp"
                  ,0x2b14,
                  "std::string spirv_cross::CompilerGLSL::flattened_access_chain_matrix(uint32_t, const uint32_t *, uint32_t, const SPIRType &, uint32_t, uint32_t, bool)"
                 );
  }
  SPIRType::SPIRType((SPIRType *)(local_1c8 + 0x28),
                     (SPIRType *)CONCAT44(in_register_0000008c,offset));
  if ((tmp_type.member_name_cache._M_h._M_single_bucket._7_1_ & 1) != 0) {
    ::std::swap<unsigned_int>(&tmp_type.basetype,&tmp_type.width);
  }
  local_1c8[0x27] = '\0';
  ::std::__cxx11::string::string((string *)this);
  type_to_glsl_constructor_abi_cxx11_
            ((CompilerGLSL *)local_1c8,(SPIRType *)CONCAT44(in_register_00000034,base));
  ::std::__cxx11::string::operator+=((string *)this,(string *)local_1c8);
  ::std::__cxx11::string::~string((string *)local_1c8);
  ::std::__cxx11::string::operator+=((string *)this,"(");
  for (local_1f8._32_4_ = 0; (uint)local_1f8._32_4_ < tmp_type.width;
      local_1f8._32_4_ = local_1f8._32_4_ + 1) {
    if (local_1f8._32_4_ != 0) {
      ::std::__cxx11::string::operator+=((string *)this,", ");
    }
    flattened_access_chain_vector_abi_cxx11_
              ((CompilerGLSL *)local_1f8,base,(uint32_t *)((ulong)indices & 0xffffffff),count,
               (SPIRType *)((ulong)target_type & 0xffffffff),(int)local_1c8 + 0x28,
               matrix_stride + local_1f8._32_4_ * _need_transpose,need_transpose);
    ::std::__cxx11::string::operator+=((string *)this,(string *)local_1f8);
    ::std::__cxx11::string::~string((string *)local_1f8);
  }
  ::std::__cxx11::string::operator+=((string *)this,")");
  local_1c8[0x27] = '\x01';
  SPIRType::~SPIRType((SPIRType *)(local_1c8 + 0x28));
  return this;
}

Assistant:

std::string CompilerGLSL::flattened_access_chain_matrix(uint32_t base, const uint32_t *indices, uint32_t count,
                                                        const SPIRType &target_type, uint32_t offset,
                                                        uint32_t matrix_stride, bool need_transpose)
{
	assert(matrix_stride);
	SPIRType tmp_type = target_type;
	if (need_transpose)
		swap(tmp_type.vecsize, tmp_type.columns);

	std::string expr;

	expr += type_to_glsl_constructor(tmp_type);
	expr += "(";

	for (uint32_t i = 0; i < tmp_type.columns; i++)
	{
		if (i != 0)
			expr += ", ";

		expr += flattened_access_chain_vector(base, indices, count, tmp_type, offset + i * matrix_stride, matrix_stride,
		                                      /* need_transpose= */ false);
	}

	expr += ")";

	return expr;
}